

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O0

Gia_MmStep_t * Gia_MmStepStart(int nSteps)

{
  Gia_MmStep_t *__s;
  Gia_MmFixed_t **ppGVar1;
  Gia_MmFixed_t *pGVar2;
  char **ppcVar3;
  int local_20;
  int local_1c;
  int k;
  int i;
  Gia_MmStep_t *p;
  int nSteps_local;
  
  __s = (Gia_MmStep_t *)malloc(0x30);
  memset(__s,0,0x30);
  __s->nMems = nSteps;
  ppGVar1 = (Gia_MmFixed_t **)malloc((long)__s->nMems << 3);
  __s->pMems = ppGVar1;
  for (local_1c = 0; local_1c < __s->nMems; local_1c = local_1c + 1) {
    pGVar2 = Gia_MmFixedStart(8 << ((byte)local_1c & 0x1f),0x2000);
    __s->pMems[local_1c] = pGVar2;
  }
  __s->nMapSize = 4 << ((byte)__s->nMems & 0x1f);
  ppGVar1 = (Gia_MmFixed_t **)malloc((long)(__s->nMapSize + 1) << 3);
  __s->pMap = ppGVar1;
  *__s->pMap = (Gia_MmFixed_t *)0x0;
  for (local_20 = 1; local_20 < 5; local_20 = local_20 + 1) {
    __s->pMap[local_20] = *__s->pMems;
  }
  for (local_1c = 0; local_1c < __s->nMems; local_1c = local_1c + 1) {
    local_20 = 4 << ((byte)local_1c & 0x1f);
    while (local_20 = local_20 + 1, local_20 <= 8 << ((byte)local_1c & 0x1f)) {
      __s->pMap[local_20] = __s->pMems[local_1c];
    }
  }
  __s->nChunksAlloc = 0x40;
  __s->nChunks = 0;
  ppcVar3 = (char **)malloc((long)__s->nChunksAlloc << 3);
  __s->pChunks = ppcVar3;
  return __s;
}

Assistant:

Gia_MmStep_t * Gia_MmStepStart( int nSteps )
{
    Gia_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Gia_MmStep_t, 1 );
    memset( p, 0, sizeof(Gia_MmStep_t) );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Gia_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Gia_MmFixedStart( (8<<i), (1<<13) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Gia_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );
    return p;
}